

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

void Abc_NtkInsertMfs(Abc_Ntk_t *pNtk,Sfm_Ntk_t *p)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  void *__s;
  ulong uVar8;
  Vec_Int_t *vMemory;
  int *__ptr;
  Vec_Int_t *pVVar9;
  word *puTruth;
  long lVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  Mem_Flex_t *pMan;
  Vec_Ptr_t *pVVar14;
  
  pVVar14 = pNtk->vObjs;
  iVar1 = pVVar14->nSize;
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  if (iVar6 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar6 << 2);
  }
  memset(__s,0,(long)iVar1 * 4);
  uVar8 = (ulong)pNtk->vCis->nSize;
  if (0 < (long)uVar8) {
    ppvVar2 = pNtk->vCis->pArray;
    uVar11 = 0;
    do {
      pvVar3 = ppvVar2[uVar11];
      iVar6 = *(int *)((long)pvVar3 + 0x40);
      if (((long)iVar6 < 0) || (iVar1 <= iVar6)) goto LAB_0027bca3;
      *(undefined4 *)((long)__s + (long)iVar6 * 4) = *(undefined4 *)((long)pvVar3 + 0x10);
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar8);
  }
  if (0 < iVar1) {
    ppvVar2 = pVVar14->pArray;
    lVar10 = 0;
    do {
      pvVar3 = ppvVar2[lVar10];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
        iVar6 = *(int *)((long)pvVar3 + 0x40);
        if (0 < (long)iVar6) {
          if (iVar1 <= iVar6) {
LAB_0027bca3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)((long)__s + (long)iVar6 * 4) = *(undefined4 *)((long)pvVar3 + 0x10);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar1);
    if (0 < iVar1) {
      lVar10 = 0;
      do {
        pAVar4 = (Abc_Obj_t *)pVVar14->pArray[lVar10];
        if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
          iVar6 = Sfm_NodeReadFixed(p,(pAVar4->field_6).iTemp);
          if (iVar6 == 0) {
            Abc_ObjRemoveFanins(pAVar4);
          }
        }
        lVar10 = lVar10 + 1;
        pVVar14 = pNtk->vObjs;
      } while (lVar10 < pVVar14->nSize);
      bVar5 = 0 < pVVar14->nSize;
      goto LAB_0027ba70;
    }
  }
  bVar5 = false;
LAB_0027ba70:
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  __ptr = (int *)malloc(0x40000);
  vMemory->pArray = __ptr;
  if (bVar5) {
    lVar10 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)pVVar14->pArray[lVar10];
      if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) &&
         ((pAVar4->field_6).iTemp != 0)) {
        iVar6 = Sfm_NodeReadFixed(p,(pAVar4->field_6).iTemp);
        if (iVar6 == 0) {
          iVar6 = Sfm_NodeReadUsed(p,(pAVar4->field_6).iTemp);
          if (iVar6 == 0) {
            Abc_NtkDeleteObj(pAVar4);
          }
          else {
            pVVar9 = Sfm_NodeReadFanins(p,(pAVar4->field_6).iTemp);
            if (0 < pVVar9->nSize) {
              lVar12 = 0;
              do {
                iVar6 = pVVar9->pArray[lVar12];
                if (((long)iVar6 < 0) || (iVar1 <= iVar6)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                iVar6 = *(int *)((long)__s + (long)iVar6 * 4);
                if (((long)iVar6 < 0) || (pNtk->vObjs->nSize <= iVar6)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                Abc_ObjAddFanin(pAVar4,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar6]);
                lVar12 = lVar12 + 1;
              } while (lVar12 < pVVar9->nSize);
            }
            puTruth = Sfm_NodeReadTruth(p,(pAVar4->field_6).iTemp);
            if (*puTruth == 0xffffffffffffffff) {
              pMan = (Mem_Flex_t *)pNtk->pManFunc;
              pcVar13 = " 1\n";
LAB_0027bbb0:
              pcVar13 = Abc_SopRegister(pMan,pcVar13);
              (pAVar4->field_5).pData = pcVar13;
            }
            else {
              if (*puTruth == 0) {
                pMan = (Mem_Flex_t *)pNtk->pManFunc;
                pcVar13 = " 0\n";
                goto LAB_0027bbb0;
              }
              uVar7 = Kit_TruthIsop((uint *)puTruth,pVVar9->nSize,vMemory,1);
              if (pVVar9->nSize < 1) {
                __assert_fail("Vec_IntSize(vArray) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                              ,0xe4,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
              }
              if (1 < uVar7) {
                __assert_fail("RetValue == 0 || RetValue == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                              ,0xe5,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
              }
              pcVar13 = Abc_SopCreateFromIsop((Mem_Flex_t *)pNtk->pManFunc,pVVar9->nSize,vMemory);
              (pAVar4->field_5).pData = pcVar13;
              if (uVar7 != 0) {
                Abc_SopComplement(pcVar13);
                pcVar13 = (char *)(pAVar4->field_5).pData;
              }
            }
            iVar6 = Abc_SopGetVarNum(pcVar13);
            if (iVar6 != pVVar9->nSize) {
              __assert_fail("Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                            ,0xea,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar14 = pNtk->vObjs;
    } while (lVar10 < pVVar14->nSize);
    __ptr = vMemory->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vMemory);
  if (__s != (void *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Abc_NtkInsertMfs( Abc_Ntk_t * pNtk, Sfm_Ntk_t * p )
{
    Vec_Int_t * vCover, * vMap, * vArray;
    Abc_Obj_t * pNode;
    word * pTruth;
    int i, k, Fanin;
    // map new IDs into old nodes
    vMap = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->iTemp > 0 )
            Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    // remove old fanins
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Sfm_NodeReadFixed(p, pNode->iTemp) )
            Abc_ObjRemoveFanins( pNode );
    // create new fanins
    vCover = Vec_IntAlloc( 1 << 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->iTemp == 0 || Sfm_NodeReadFixed(p, pNode->iTemp) )
            continue;
        if ( !Sfm_NodeReadUsed(p, pNode->iTemp) )
        {
            Abc_NtkDeleteObj( pNode );
            continue;
        }
        // update fanins
        vArray = Sfm_NodeReadFanins( p, pNode->iTemp );
        Vec_IntForEachEntry( vArray, Fanin, k )
            Abc_ObjAddFanin( pNode, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, Fanin)) );
        // update function
        pTruth = Sfm_NodeReadTruth( p, pNode->iTemp );
        if ( pTruth[0] == 0 )
            pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 0\n" );
        else if ( ~pTruth[0] == 0 )
            pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 1\n" );
        else
        {
            int RetValue = Kit_TruthIsop( (unsigned *)pTruth, Vec_IntSize(vArray), vCover, 1 );
            assert( Vec_IntSize(vArray) > 0 );
            assert( RetValue == 0 || RetValue == 1 );
            pNode->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntSize(vArray), vCover );
            if ( RetValue )
                Abc_SopComplement( (char *)pNode->pData );
        }
        assert( Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray) );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vMap );
}